

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticModelTester.cpp
# Opt level: O3

void __thiscall psy::C::SemanticModelTester::case0452(SemanticModelTester *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _func_int **pp_Var2;
  TypeKind TVar3;
  BasicTypeKind BVar4;
  int iVar5;
  EnumeratorDeclarationSyntax *pEVar6;
  MemberDeclarationSymbol *pMVar7;
  Lexeme *pLVar8;
  Type *pTVar9;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ostream *poVar10;
  undefined4 extraout_var_02;
  undefined8 uVar11;
  string local_78;
  undefined1 local_58 [16];
  size_type *local_48;
  size_type local_38 [2];
  
  paVar1 = &local_78.field_2;
  local_78._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"enum x { y , z } ;","");
  local_48 = local_38;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"");
  compile<psy::C::EnumDeclarationSyntax>((SemanticModelTester *)local_58,(string *)this,&local_78);
  if (local_48 != local_38) {
    operator_delete(local_48,local_38[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  pp_Var2 = ((TestSuite *)(local_58._8_8_ + 0x28))->_vptr_TestSuite;
  pEVar6 = (EnumeratorDeclarationSyntax *)(**(code **)(**(long **)(pp_Var2[7] + 8) + 0x90))();
  pMVar7 = &SemanticModel::enumeratorFor((SemanticModel *)local_58._0_8_,pEVar6)->
            super_MemberDeclarationSymbol;
  if (pMVar7 == (MemberDeclarationSymbol *)0x0) {
    poVar10 = std::operator<<((ostream *)&std::cout,"\n!\tFAIL\n");
    poVar10 = std::operator<<(poVar10,"\t\tExpression is NOT ");
    poVar10 = std::operator<<(poVar10,"true");
    poVar10 = std::operator<<(poVar10,"\n");
    poVar10 = std::operator<<(poVar10,"\t\t");
    poVar10 = std::operator<<(poVar10,
                              "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
                             );
    poVar10 = std::operator<<(poVar10,":");
    iVar5 = 0x34c;
  }
  else {
    pLVar8 = &MemberDeclarationSymbol::name(pMVar7)->super_Lexeme;
    Lexeme::valueText_abi_cxx11_(&local_78,pLVar8);
    iVar5 = std::__cxx11::string::compare((char *)&local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != paVar1) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
    if (iVar5 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n!\tFAIL\n",8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t\tActual  : ",0xc)
      ;
      pLVar8 = &MemberDeclarationSymbol::name(pMVar7)->super_Lexeme;
      Lexeme::valueText_abi_cxx11_(&local_78,pLVar8);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,local_78._M_dataplus._M_p,local_78._M_string_length
                          );
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\t\tExpected: ",0xc);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"y",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\t\t",2);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar10,
                 "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
                 ,99);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,":",1);
      poVar10 = (ostream *)std::ostream::operator<<((ostream *)poVar10,0x34d);
      std::endl<char,std::char_traits<char>>(poVar10);
LAB_003e459b:
      std::__cxx11::string::~string((string *)&local_78);
      goto LAB_003e471f;
    }
    pTVar9 = MemberDeclarationSymbol::type(pMVar7);
    TVar3 = Type::kind(pTVar9);
    if (TVar3 == Basic) {
      pTVar9 = MemberDeclarationSymbol::type(pMVar7);
      iVar5 = (*pTVar9->_vptr_Type[5])(pTVar9);
      BVar4 = BasicType::kind((BasicType *)CONCAT44(extraout_var,iVar5));
      if (BVar4 == Int_S) {
        pEVar6 = (EnumeratorDeclarationSyntax *)
                 (**(code **)(**(long **)(*(long *)(pp_Var2[7] + 0x10) + 8) + 0x90))();
        pMVar7 = &SemanticModel::enumeratorFor((SemanticModel *)local_58._0_8_,pEVar6)->
                  super_MemberDeclarationSymbol;
        if (pMVar7 == (MemberDeclarationSymbol *)0x0) {
          poVar10 = std::operator<<((ostream *)&std::cout,"\n!\tFAIL\n");
          poVar10 = std::operator<<(poVar10,"\t\tExpression is NOT ");
          poVar10 = std::operator<<(poVar10,"true");
          poVar10 = std::operator<<(poVar10,"\n");
          poVar10 = std::operator<<(poVar10,"\t\t");
          poVar10 = std::operator<<(poVar10,
                                    "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
                                   );
          poVar10 = std::operator<<(poVar10,":");
          iVar5 = 0x354;
        }
        else {
          pLVar8 = &MemberDeclarationSymbol::name(pMVar7)->super_Lexeme;
          Lexeme::valueText_abi_cxx11_(&local_78,pLVar8);
          iVar5 = std::__cxx11::string::compare((char *)&local_78);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_78._M_dataplus._M_p != paVar1) {
            operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
          }
          if (iVar5 != 0) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"\n!\tFAIL\n",8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"\t\tActual  : ",0xc);
            pLVar8 = &MemberDeclarationSymbol::name(pMVar7)->super_Lexeme;
            Lexeme::valueText_abi_cxx11_(&local_78,pLVar8);
            poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cout,local_78._M_dataplus._M_p,
                                 local_78._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
            std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\t\tExpected: ",0xc);
            std::__ostream_insert<char,std::char_traits<char>>(poVar10,"z",1);
            std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
            std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\t\t",2);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar10,
                       "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
                       ,99);
            std::__ostream_insert<char,std::char_traits<char>>(poVar10,":",1);
            poVar10 = (ostream *)std::ostream::operator<<((ostream *)poVar10,0x355);
            std::endl<char,std::char_traits<char>>(poVar10);
            goto LAB_003e459b;
          }
          pTVar9 = MemberDeclarationSymbol::type(pMVar7);
          TVar3 = Type::kind(pTVar9);
          if (TVar3 == Basic) {
            pTVar9 = MemberDeclarationSymbol::type(pMVar7);
            iVar5 = (*pTVar9->_vptr_Type[5])(pTVar9);
            BVar4 = BasicType::kind((BasicType *)CONCAT44(extraout_var_00,iVar5));
            if (BVar4 == Int_S) {
              return;
            }
            poVar10 = std::operator<<((ostream *)&std::cout,"\n!\tFAIL\n");
            poVar10 = std::operator<<(poVar10,"\t\tActual  : ");
            pTVar9 = MemberDeclarationSymbol::type(pMVar7);
            iVar5 = (*pTVar9->_vptr_Type[5])(pTVar9);
            BVar4 = BasicType::kind((BasicType *)CONCAT44(extraout_var_02,iVar5));
            poVar10 = C::operator<<(poVar10,BVar4);
            poVar10 = std::operator<<(poVar10,"\n");
            poVar10 = std::operator<<(poVar10,"\t\tExpected: ");
            poVar10 = C::operator<<(poVar10,Int_S);
            poVar10 = std::operator<<(poVar10,"\n");
            poVar10 = std::operator<<(poVar10,"\t\t");
            poVar10 = std::operator<<(poVar10,
                                      "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
                                     );
            poVar10 = std::operator<<(poVar10,":");
            iVar5 = 0x357;
          }
          else {
            poVar10 = std::operator<<((ostream *)&std::cout,"\n!\tFAIL\n");
            poVar10 = std::operator<<(poVar10,"\t\tActual  : ");
            pTVar9 = MemberDeclarationSymbol::type(pMVar7);
            TVar3 = Type::kind(pTVar9);
            poVar10 = ::operator<<(poVar10,TVar3);
            poVar10 = std::operator<<(poVar10,"\n");
            poVar10 = std::operator<<(poVar10,"\t\tExpected: ");
            poVar10 = ::operator<<(poVar10,Basic);
            poVar10 = std::operator<<(poVar10,"\n");
            poVar10 = std::operator<<(poVar10,"\t\t");
            poVar10 = std::operator<<(poVar10,
                                      "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
                                     );
            poVar10 = std::operator<<(poVar10,":");
            iVar5 = 0x356;
          }
        }
      }
      else {
        poVar10 = std::operator<<((ostream *)&std::cout,"\n!\tFAIL\n");
        poVar10 = std::operator<<(poVar10,"\t\tActual  : ");
        pTVar9 = MemberDeclarationSymbol::type(pMVar7);
        iVar5 = (*pTVar9->_vptr_Type[5])(pTVar9);
        BVar4 = BasicType::kind((BasicType *)CONCAT44(extraout_var_01,iVar5));
        poVar10 = C::operator<<(poVar10,BVar4);
        poVar10 = std::operator<<(poVar10,"\n");
        poVar10 = std::operator<<(poVar10,"\t\tExpected: ");
        poVar10 = C::operator<<(poVar10,Int_S);
        poVar10 = std::operator<<(poVar10,"\n");
        poVar10 = std::operator<<(poVar10,"\t\t");
        poVar10 = std::operator<<(poVar10,
                                  "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
                                 );
        poVar10 = std::operator<<(poVar10,":");
        iVar5 = 0x34f;
      }
    }
    else {
      poVar10 = std::operator<<((ostream *)&std::cout,"\n!\tFAIL\n");
      poVar10 = std::operator<<(poVar10,"\t\tActual  : ");
      pTVar9 = MemberDeclarationSymbol::type(pMVar7);
      TVar3 = Type::kind(pTVar9);
      poVar10 = ::operator<<(poVar10,TVar3);
      poVar10 = std::operator<<(poVar10,"\n");
      poVar10 = std::operator<<(poVar10,"\t\tExpected: ");
      poVar10 = ::operator<<(poVar10,Basic);
      poVar10 = std::operator<<(poVar10,"\n");
      poVar10 = std::operator<<(poVar10,"\t\t");
      poVar10 = std::operator<<(poVar10,
                                "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
                               );
      poVar10 = std::operator<<(poVar10,":");
      iVar5 = 0x34e;
    }
  }
  poVar10 = (ostream *)std::ostream::operator<<((ostream *)poVar10,iVar5);
  std::endl<char,std::char_traits<char>>(poVar10);
LAB_003e471f:
  uVar11 = __cxa_allocate_exception(1);
  __cxa_throw(uVar11,&TestFailed::typeinfo,0);
}

Assistant:

void SemanticModelTester::case0452()
{
    auto [tyDeclNode, semaModel] =
            compile<EnumDeclarationSyntax>("enum x { y , z } ;");

    auto tySpec = tyDeclNode->typeSpecifier();

    auto enumeratorDecl0 = tySpec->declarations()->value->asEnumeratorDeclaration();

    const EnumeratorDeclarationSymbol* enumeratorSym0 = semaModel->enumeratorFor(enumeratorDecl0);
    PSY_EXPECT_TRUE(enumeratorSym0);
    PSY_EXPECT_EQ_STR(enumeratorSym0->name()->valueText(), "y");
    PSY_EXPECT_EQ_ENU(enumeratorSym0->type()->kind(), TypeKind::Basic, TypeKind);
    PSY_EXPECT_EQ_ENU(enumeratorSym0->type()->asBasicType()->kind(), BasicTypeKind::Int_S, BasicTypeKind);

    auto enumeratorDecl1 = tySpec->declarations()->next->value->asEnumeratorDeclaration();

    const EnumeratorDeclarationSymbol* enumeratorSym1 = semaModel->enumeratorFor(enumeratorDecl1);
    PSY_EXPECT_TRUE(enumeratorSym1);
    PSY_EXPECT_EQ_STR(enumeratorSym1->name()->valueText(), "z");
    PSY_EXPECT_EQ_ENU(enumeratorSym1->type()->kind(), TypeKind::Basic, TypeKind);
    PSY_EXPECT_EQ_ENU(enumeratorSym1->type()->asBasicType()->kind(), BasicTypeKind::Int_S, BasicTypeKind);
}